

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O2

QString * QCoreApplication::applicationVersion(void)

{
  Type *pTVar1;
  QArrayDataPointer<char16_t> *in_RDI;
  QArrayDataPointer<char16_t> *this;
  
  this = in_RDI;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>
                       *)in_RDI);
  if (pTVar1 == (Type *)0x0) {
    in_RDI->d = (Data *)0x0;
    in_RDI->ptr = (char16_t *)0x0;
    in_RDI->size = 0;
  }
  else {
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
             operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>
                         *)this);
    QArrayDataPointer<char16_t>::QArrayDataPointer(in_RDI,&(pTVar1->applicationVersion).d);
  }
  return (QString *)in_RDI;
}

Assistant:

QString QCoreApplication::applicationVersion()
{
    return coreappdata() ? coreappdata()->applicationVersion : QString();
}